

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O0

int SUNLinSolSolve_Band(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol)

{
  sunrealtype **ppsVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  SUNMatrix in_RSI;
  long *in_RDI;
  sunindextype *pivots;
  sunrealtype *xdata;
  sunrealtype **A_cols;
  SUNContext_conflict sunctx_local_scope_;
  
  N_VScale(0x3ff0000000000000,in_RCX,in_RDX);
  ppsVar1 = SUNBandMatrix_Cols(in_RSI);
  uVar2 = N_VGetArrayPointer(in_RDX);
  SUNDlsMat_bandGBTRS(ppsVar1,*(undefined8 *)((long)in_RSI->content + 8),
                      *(undefined8 *)((long)in_RSI->content + 0x28),
                      *(undefined8 *)((long)in_RSI->content + 0x20),*(undefined8 *)(*in_RDI + 8),
                      uVar2);
  *(undefined8 *)(*in_RDI + 0x10) = 0;
  return 0;
}

Assistant:

int SUNLinSolSolve_Band(SUNLinearSolver S, SUNMatrix A, N_Vector x, N_Vector b,
                        SUNDIALS_MAYBE_UNUSED sunrealtype tol)
{
  SUNFunctionBegin(S->sunctx);
  sunrealtype **A_cols, *xdata;
  sunindextype* pivots;

  /* copy b into x */
  N_VScale(ONE, b, x);
  SUNCheckLastErr();

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  xdata  = NULL;
  pivots = NULL;
  A_cols = SUNBandMatrix_Cols(A);
  SUNCheckLastErr();
  xdata = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  pivots = PIVOTS(S);
  SUNAssert(pivots, SUN_ERR_ARG_CORRUPT);

  /* solve using LU factors */
  SUNDlsMat_bandGBTRS(A_cols, SM_COLUMNS_B(A), SM_SUBAND_B(A), SM_LBAND_B(A),
                      pivots, xdata);
  LASTFLAG(S) = SUN_SUCCESS;
  return SUN_SUCCESS;
}